

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

int normal_scanLt(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  byte *pbVar4;
  char *pcVar5;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char **nextTokPtr_local;
  char *end_local;
  char *ptr_local;
  ENCODING *enc_local;
  
  if ((long)end - (long)ptr < 1) {
    return -1;
  }
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
  case 5:
    if ((long)end - (long)ptr < 2) {
      return -2;
    }
    iVar3 = (*enc[3].literalScanners[0])(enc,ptr,end,(char **)ptr);
    if (iVar3 == 0) {
      *nextTokPtr = ptr;
      return 0;
    }
    end_local = ptr + 2;
    pcVar5 = extraout_RDX;
    goto LAB_006dcc17;
  case 6:
    if ((long)end - (long)ptr < 3) {
      return -2;
    }
    iVar3 = (*enc[3].literalScanners[1])(enc,ptr,end,(char **)ptr);
    if (iVar3 == 0) {
      *nextTokPtr = ptr;
      return 0;
    }
    end_local = ptr + 3;
    pcVar5 = extraout_RDX_00;
    goto LAB_006dcc17;
  case 7:
    if ((long)end - (long)ptr < 4) {
      return -2;
    }
    iVar3 = (*enc[3].nameMatchesAscii)(enc,ptr,end,ptr);
    if (iVar3 == 0) {
      *nextTokPtr = ptr;
      return 0;
    }
    end_local = ptr + 4;
    pcVar5 = extraout_RDX_01;
    goto LAB_006dcc17;
  default:
    *nextTokPtr = ptr;
    enc_local._4_4_ = 0;
    break;
  case 0xf:
    enc_local._4_4_ = normal_scanPi(enc,ptr + 1,end,nextTokPtr);
    break;
  case 0x10:
    pbVar4 = (byte *)(ptr + 1);
    if ((long)end - (long)pbVar4 < 1) {
      enc_local._4_4_ = -1;
    }
    else {
      cVar1 = *(char *)((long)enc[1].scanners + (ulong)*pbVar4);
      if (cVar1 == '\x14') {
        enc_local._4_4_ = normal_scanCdataSection(enc,ptr + 2,end,nextTokPtr);
      }
      else if (cVar1 == '\x1b') {
        enc_local._4_4_ = normal_scanComment(enc,ptr + 2,end,nextTokPtr);
      }
      else {
        *nextTokPtr = (char *)pbVar4;
        enc_local._4_4_ = 0;
      }
    }
    break;
  case 0x11:
    enc_local._4_4_ = normal_scanEndTag(enc,ptr + 1,end,nextTokPtr);
    break;
  case 0x16:
  case 0x18:
    end_local = ptr + 1;
    pcVar5 = end;
LAB_006dcc17:
    while (0 < (long)end - (long)end_local) {
      switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*end_local)) {
      case 5:
        if ((long)end - (long)end_local < 2) {
          return -2;
        }
        iVar3 = (*enc[3].scanners[0])(enc,end_local,pcVar5,(char **)end_local);
        if (iVar3 == 0) {
          *nextTokPtr = end_local;
          return 0;
        }
        end_local = end_local + 2;
        pcVar5 = extraout_RDX_02;
        break;
      case 6:
        if ((long)end - (long)end_local < 3) {
          return -2;
        }
        iVar3 = (*enc[3].scanners[1])(enc,end_local,pcVar5,(char **)end_local);
        if (iVar3 == 0) {
          *nextTokPtr = end_local;
          return 0;
        }
        end_local = end_local + 3;
        pcVar5 = extraout_RDX_03;
        break;
      case 7:
        if ((long)end - (long)end_local < 4) {
          return -2;
        }
        iVar3 = (*enc[3].scanners[2])(enc,end_local,pcVar5,(char **)end_local);
        if (iVar3 == 0) {
          *nextTokPtr = end_local;
          return 0;
        }
        end_local = end_local + 4;
        pcVar5 = extraout_RDX_04;
        break;
      default:
        *nextTokPtr = end_local;
        return 0;
      case 9:
      case 10:
      case 0x15:
        pcVar2 = end_local;
        goto LAB_006dcdb6;
      case 0xb:
        goto LAB_006dcf9d;
      case 0x11:
        goto LAB_006dcfba;
      case 0x16:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
        end_local = end_local + 1;
        break;
      case 0x1d:
        *nextTokPtr = end_local;
        return 0;
      }
    }
    enc_local._4_4_ = -1;
    break;
  case 0x1d:
    *nextTokPtr = ptr;
    enc_local._4_4_ = 0;
  }
  return enc_local._4_4_;
switchD_006dce02_caseD_9:
  pcVar2 = end_local;
LAB_006dcdb6:
  end_local = pcVar2 + 1;
  if ((long)end - (long)end_local < 1) {
    return -1;
  }
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*end_local)) {
  case 5:
    if ((long)end - (long)end_local < 2) {
      return -2;
    }
    iVar3 = (*enc[3].literalScanners[0])(enc,end_local,pcVar5,(char **)end_local);
    if (iVar3 == 0) {
      *nextTokPtr = end_local;
      return 0;
    }
    end_local = pcVar2 + 3;
    break;
  case 6:
    if ((long)end - (long)end_local < 3) {
      return -2;
    }
    iVar3 = (*enc[3].literalScanners[1])(enc,end_local,pcVar5,(char **)end_local);
    if (iVar3 == 0) {
      *nextTokPtr = end_local;
      return 0;
    }
    end_local = pcVar2 + 4;
    break;
  case 7:
    if ((long)end - (long)end_local < 4) {
      return -2;
    }
    iVar3 = (*enc[3].nameMatchesAscii)(enc,end_local,pcVar5,end_local);
    if (iVar3 == 0) {
      *nextTokPtr = end_local;
      return 0;
    }
    end_local = pcVar2 + 5;
    break;
  default:
    *nextTokPtr = end_local;
    return 0;
  case 9:
  case 10:
  case 0x15:
    goto switchD_006dce02_caseD_9;
  case 0xb:
LAB_006dcf9d:
    *nextTokPtr = end_local + 1;
    return 2;
  case 0x11:
LAB_006dcfba:
    pcVar5 = end_local + 1;
    if ((long)end - (long)pcVar5 < 1) {
      return -1;
    }
    if (*pcVar5 != '>') {
      *nextTokPtr = pcVar5;
      return 0;
    }
    *nextTokPtr = end_local + 2;
    return 4;
  case 0x16:
  case 0x18:
    end_local = pcVar2 + 2;
    break;
  case 0x1d:
    *nextTokPtr = end_local;
    return 0;
  }
  iVar3 = normal_scanAtts(enc,end_local,end,nextTokPtr);
  return iVar3;
}

Assistant:

static int PTRCALL
PREFIX(scanLt)(const ENCODING *enc, const char *ptr, const char *end,
               const char **nextTokPtr)
{
#ifdef XML_NS
  int hadColon;
#endif
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
  CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_EXCL:
    ptr += MINBPC(enc);
    REQUIRE_CHAR(enc, ptr, end);
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_MINUS:
      return PREFIX(scanComment)(enc, ptr + MINBPC(enc), end, nextTokPtr);
    case BT_LSQB:
      return PREFIX(scanCdataSection)(enc, ptr + MINBPC(enc),
                                      end, nextTokPtr);
    }
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  case BT_QUEST:
    return PREFIX(scanPi)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_SOL:
    return PREFIX(scanEndTag)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
#ifdef XML_NS
  hadColon = 0;
#endif
  /* we have a start-tag */
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
#ifdef XML_NS
    case BT_COLON:
      if (hadColon) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      hadColon = 1;
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
      default:
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      break;
#endif
    case BT_S: case BT_CR: case BT_LF:
      {
        ptr += MINBPC(enc);
        while (HAS_CHAR(enc, ptr, end)) {
          switch (BYTE_TYPE(enc, ptr)) {
          CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
          case BT_GT:
            goto gt;
          case BT_SOL:
            goto sol;
          case BT_S: case BT_CR: case BT_LF:
            ptr += MINBPC(enc);
            continue;
          default:
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
          return PREFIX(scanAtts)(enc, ptr, end, nextTokPtr);
        }
        return XML_TOK_PARTIAL;
      }
    case BT_GT:
    gt:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_START_TAG_NO_ATTS;
    case BT_SOL:
    sol:
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_EMPTY_ELEMENT_NO_ATTS;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}